

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O1

void license::printHelpHeader(char *prog_name)

{
  ostream *poVar1;
  allocator local_51;
  char *local_50;
  long local_48;
  char local_40 [16];
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__cxx11::string::string((string *)local_30,prog_name,&local_51);
  boost::filesystem::path::filename();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Version ",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"",0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,". Usage:",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

static void printHelpHeader(const char *prog_name) {
	cout << endl;
	cout << fs::path(prog_name).filename().string() << " Version " << PROJECT_VERSION << ". Usage:" << endl;
}